

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  _Rb_tree_header *p_Var1;
  cmake *pcVar2;
  cmMakefile *this_00;
  cmExternalMakefileProjectGenerator *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  pointer puVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  PolicyID id;
  PolicyID id_00;
  char *__end;
  ulong uVar11;
  ostringstream w;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  cmake *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  (*this->_vptr_cmGlobalGenerator[0x3d])();
  ProcessEvaluationFiles(this);
  pcVar2 = this->CMakeInstance;
  local_1a8._M_allocated_capacity = (size_type)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Generating","");
  cmake::UpdateProgress(pcVar2,(string *)&local_1a8,0.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1);
  }
  puVar7 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar7) {
    uVar11 = 0;
    do {
      this->CurrentConfigureMakefile =
           (puVar7[uVar11]._M_t.
            super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
            super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
            super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
      (*(puVar7[uVar11]._M_t.
         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
         super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->_vptr_cmLocalGenerator[2])
                ();
      this_00 = *(cmMakefile **)
                 ((long)(this->LocalGenerators).
                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t + 0x70);
      local_1a8._M_allocated_capacity = (size_type)local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"CMAKE_SKIP_INSTALL_RULES","");
      bVar4 = cmMakefile::IsOn(this_00,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      if (!bVar4) {
        cmLocalGenerator::GenerateInstallRules
                  ((cmLocalGenerator *)
                   (this->LocalGenerators).
                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t);
      }
      cmLocalGenerator::GenerateTestFiles
                ((cmLocalGenerator *)
                 (this->LocalGenerators).
                 super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t);
      pcVar2 = this->CMakeInstance;
      local_1a8._M_allocated_capacity = (size_type)local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Generating","");
      cmake::UpdateProgress
                (pcVar2,(string *)&local_1a8,
                 (((float)uVar11 + 1.0) * 0.9) /
                 (float)(ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->LocalGenerators).
                                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) + 0.1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      puVar7 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3))
    ;
  }
  this->CurrentConfigureMakefile = (cmMakefile *)0x0;
  GenerateCPackPropertiesFile(this);
  p_Var8 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar4 = (_Rb_tree_header *)p_Var8 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header
    ;
    if (!bVar4) {
LAB_00263adc:
      CheckRuleHashes(this);
      WriteSummary(this);
      pcVar3 = (this->ExtraGenerator)._M_t.
               super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
      if (pcVar3 != (cmExternalMakefileProjectGenerator *)0x0) {
        (*pcVar3->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      CheckTargetLinkLibraries(this);
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x2a,id);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_1e8._0_8_,local_1e8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "MACOSX_RPATH is not specified for the following targets:\n",0x39);
        p_Var10 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1a8,*(char **)(p_Var10 + 1),
                                (long)p_Var10[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var1);
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        local_1c8._M_allocated_capacity = 0;
        local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1c8);
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_1e8,
                            (cmListFileBacktrace *)&local_1c8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
        }
        if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
        std::ios_base::~ios_base(local_138);
      }
      if ((this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  ((string *)local_1e8,(cmPolicies *)&DAT_00000044,id_00);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_1e8._0_8_,local_1e8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,
                   "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                   ,0x89);
        if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        p_Var10 = (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1a8,*(char **)(p_Var10 + 1),
                                (long)p_Var10[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var1);
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        local_1c8._M_allocated_capacity = 0;
        local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1c8);
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_1e8,
                            (cmListFileBacktrace *)&local_1c8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
        }
        if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
        std::ios_base::~ios_base(local_138);
      }
      pcVar2 = this->CMakeInstance;
      local_1a8._M_allocated_capacity = (size_type)local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Generating done","");
      cmake::UpdateProgress(pcVar2,(string *)&local_1a8,-1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      return;
    }
    bVar5 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var8 + 2));
    if (!bVar5) {
      if (((cmSystemTools::s_ErrorOccurred == false) &&
          (cmSystemTools::s_FatalErrorOccurred == false)) &&
         (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
        local_1b0 = this->CMakeInstance;
        local_1a8._M_allocated_capacity = (size_type)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"Could not write export file.","");
        local_1e8._0_8_ = (element_type *)0x0;
        local_1e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1e8);
        cmake::IssueMessage(local_1b0,FATAL_ERROR,(string *)&local_1a8,
                            (cmListFileBacktrace *)local_1e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          local_198[0]._M_allocated_capacity + 1);
        }
      }
      if (!bVar5) {
        if (bVar4) {
          return;
        }
        goto LAB_00263adc;
      }
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  this->CMakeInstance->UpdateProgress("Generating", 0.1f);

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      0.1f +
        0.9f * (static_cast<float>(i) + 1.0f) /
          static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccurredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  // Perform validation checks on memoized link structures.
  this->CheckTargetLinkLibraries();

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}